

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::~vector
          (vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this)

{
  uint uVar1;
  void *p;
  vq_node *p_00;
  long lVar2;
  
  p_00 = this->m_p;
  if (p_00 != (vq_node *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar2 = 0;
      do {
        p = *(void **)((long)(&p_00->m_centroid + 1) + lVar2 + 0x10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar2 = lVar2 + 0x70;
      } while ((ulong)uVar1 * 0x70 - lVar2 != 0);
      p_00 = this->m_p;
    }
    crnlib_free(p_00);
  }
  return;
}

Assistant:

inline ~vector() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
    }
  }